

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::compiler::Expression::Builder::initTuple
          (Builder *__return_storage_ptr__,Builder *this,uint size)

{
  PointerBuilder local_28;
  
  *(undefined2 *)(this->_builder).data = 7;
  local_28.pointer = (this->_builder).pointers;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::initStructList
            (&__return_storage_ptr__->builder,&local_28,size,(StructSize)0x20001);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::compiler::Expression::Param,  ::capnp::Kind::STRUCT>::Builder Expression::Builder::initTuple(unsigned int size) {
  _builder.setDataField<Expression::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Expression::TUPLE);
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::compiler::Expression::Param,  ::capnp::Kind::STRUCT>>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), size);
}